

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# np_nes_apu.c
# Opt level: O2

_Bool NES_APU_np_Read(void *chip,UINT16 adr,UINT8 *val)

{
  byte bVar1;
  
  if ((adr & 0xfff8) == 0x4000) {
    bVar1 = *val | *(byte *)((long)chip + (ulong)(adr & 7) + 0x34);
  }
  else {
    if (adr != 0x4015) {
      return false;
    }
    bVar1 = (*(int *)((long)chip + 0x15c) != 0) * '\x02' | *val | *(int *)((long)chip + 0x158) != 0;
  }
  *val = bVar1;
  return true;
}

Assistant:

bool NES_APU_np_Read(void* chip, UINT16 adr, UINT8* val)
{
	NES_APU* apu = (NES_APU*)chip;

	if (0x4000 <= adr && adr < 0x4008)
	{
		*val |= apu->reg[adr&0x7];
		return true;
	}
	else if(adr==0x4015)
	{
		*val |= (apu->length_counter[1]?2:0)|(apu->length_counter[0]?1:0);
		return true;
	}
	else
		return false;
}